

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

void exerchk(void)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  int local_18;
  int local_c;
  int mod_val;
  int i;
  
  exerper();
  if (((uint)u.next_attr_check <= moves) && (multi == 0)) {
    local_c = 0;
    while (local_c < 6) {
      if ((((u.acurr.a[local_c] < '\x12') && (u.aexe.a[local_c] != '\0')) && (local_c != 1)) &&
         (local_c != 5)) {
        iVar2 = rn2(0x32);
        if (local_c == 2) {
          local_18 = (int)u.aexe.a[2];
          if (local_18 < 1) {
            local_18 = -local_18;
          }
        }
        else {
          local_18 = ((int)u.aexe.a[local_c] << 1) / 3;
          if (local_18 < 1) {
            local_18 = -local_18;
          }
        }
        if (iVar2 <= local_18) {
          iVar2 = sgn((int)u.aexe.a[local_c]);
          bVar1 = adjattrib(local_c,iVar2,'\0',-1);
          if (bVar1 != '\0') {
            u.aexe.a[local_c] = '\0';
            switch(local_c) {
            case 0:
              pcVar3 = "You must have been abusing your body.";
              if (0 < iVar2) {
                pcVar3 = "You must have been exercising.";
              }
              pline(pcVar3);
              break;
            case 2:
              pcVar3 = "You haven\'t been paying attention.";
              if (0 < iVar2) {
                pcVar3 = "You must have been very observant.";
              }
              pline(pcVar3);
              break;
            case 3:
              pcVar3 = "You haven\'t been working on reflexes lately.";
              if (0 < iVar2) {
                pcVar3 = "You must have been working on your reflexes.";
              }
              pline(pcVar3);
              break;
            case 4:
              pcVar3 = "You haven\'t been watching your health.";
              if (0 < iVar2) {
                pcVar3 = "You must be leading a healthy life-style.";
              }
              pline(pcVar3);
            }
          }
        }
      }
      u.aexe.a[local_c] = (schar)((long)(int)u.aexe.a[local_c] / 2);
      local_c = local_c + 1;
    }
    iVar2 = rn2(200);
    u.next_attr_check = iVar2 + 800 + u.next_attr_check;
  }
  return;
}

Assistant:

void exerchk(void)
{
	int	i, mod_val;

	/*	Check out the periodic accumulations */
	exerper();

	/*	Are we ready for a test?	*/
	if (moves >= u.next_attr_check && !multi) {
	    /*
	     *	Law of diminishing returns (Part II):
	     *
	     *	The effects of "exercise" and "abuse" wear
	     *	off over time.  Even if you *don't* get an
	     *	increase/decrease, you lose some of the
	     *	accumulated effects.
	     */
	    for (i = 0; i < A_MAX; AEXE(i++) /= 2) {

		if (ABASE(i) >= 18 || !AEXE(i)) continue;
		if (i == A_INT || i == A_CHA) continue;/* can't exercise these */

		/*
		 *	Law of diminishing returns (Part III):
		 *
		 *	You don't *always* gain by exercising.
		 *	[MRS 92/10/28 - Treat Wisdom specially for balance.]
		 */
		if (rn2(AVAL) > ((i != A_WIS) ? abs(AEXE(i)*2/3) : abs(AEXE(i))))
		    continue;
		mod_val = sgn(AEXE(i));

		if (adjattrib(i, mod_val, FALSE, -1)) {
		    /* if you actually changed an attrib - zero accumulation */
		    AEXE(i) = 0;
		    /* then print an explanation */
		    switch(i) {
		    case A_STR: pline((mod_val >0) ?
				    "You must have been exercising." :
				    "You must have been abusing your body.");
				break;
		    case A_WIS: pline((mod_val >0) ?
				    "You must have been very observant." :
				    "You haven't been paying attention.");
				break;
		    case A_DEX: pline((mod_val >0) ?
				    "You must have been working on your reflexes." :
				    "You haven't been working on reflexes lately.");
				break;
		    case A_CON: pline((mod_val >0) ?
				    "You must be leading a healthy life-style." :
				    "You haven't been watching your health.");
				break;
		    }
		}
	    }
	    u.next_attr_check += rn1(200,800);
	}
}